

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O3

aom_codec_err_t
decoder_peek_si_internal
          (uint8_t *data,size_t data_sz,aom_codec_stream_info_t *si,int *is_intra_only)

{
  aom_codec_err_t aVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  uint8_t *puVar11;
  bool bVar12;
  size_t payload_size;
  size_t bytes_read;
  ObuHeader obu_header;
  int local_cc;
  size_t local_c8;
  int local_c0;
  int local_bc;
  size_t local_b8;
  int local_ac;
  aom_read_bit_buffer local_a8;
  int *local_80;
  aom_codec_stream_info_t *local_78;
  uint *local_70;
  uint *local_68;
  uint8_t *local_60;
  ObuHeader local_58;
  
  if ((long)data_sz < 1) {
    aVar1 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    si->w = 0;
    si->h = 0;
    si->is_kf = 0;
    local_58.has_extension = 0;
    local_58.temporal_layer_id = 0;
    local_58.spatial_layer_id = 0;
    local_58._28_4_ = 0;
    local_58.size = 0;
    local_58.type = 0;
    local_58._9_3_ = 0;
    local_58.has_size_field = 0;
    local_c8 = 0;
    local_b8 = 0;
    aVar1 = aom_read_obu_header_and_size(data,data_sz,si->is_annexb,&local_58,&local_c8,&local_b8);
    if (aVar1 == AOM_CODEC_OK) {
      local_80 = is_intra_only;
      if (local_58.type == OBU_TEMPORAL_DELIMITER) {
        uVar10 = local_c8 + local_b8;
        bVar12 = data_sz < uVar10;
        data_sz = data_sz - uVar10;
        if (bVar12) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        data = data + uVar10;
        aVar1 = aom_read_obu_header_and_size
                          (data,data_sz,si->is_annexb,&local_58,&local_c8,&local_b8);
        if (aVar1 != AOM_CODEC_OK) {
          return aVar1;
        }
      }
      local_68 = &si->number_spatial_layers;
      local_70 = &si->number_temporal_layers;
      local_c0 = 0;
      bVar12 = false;
      local_cc = 0;
      local_78 = si;
      while( true ) {
        uVar10 = data_sz - local_b8;
        aVar1 = AOM_CODEC_CORRUPT_FRAME;
        if (uVar10 < local_c8) break;
        puVar11 = data + local_b8;
        iVar3 = local_cc;
        if ((local_58.type == OBU_FRAME) || (local_58.type == OBU_FRAME_HEADER)) {
          if ((bVar12) && ((char)local_c0 != '\0')) {
LAB_0016d9a8:
            si->is_kf = 1;
            goto LAB_0016d9b0;
          }
          if (data_sz == local_b8) {
            return AOM_CODEC_CORRUPT_FRAME;
          }
          local_a8.bit_buffer_end = data + data_sz;
          local_a8.bit_offset = 0;
          local_a8.error_handler_data = (void *)0x0;
          local_a8.error_handler = (aom_rb_error_handler)0x0;
          local_a8.bit_buffer = puVar11;
          iVar2 = aom_rb_read_bit(&local_a8);
          if (iVar2 == 0) {
            uVar6 = aom_rb_read_literal(&local_a8,2);
            if ((uVar6 & 0xff) == 2) {
              iVar3 = 1;
            }
            if ((uVar6 & 0xff) == 0) {
              if (!bVar12) goto LAB_0016d9b0;
              goto LAB_0016d9a8;
            }
          }
        }
        else if (local_58.type == OBU_SEQUENCE_HEADER) {
          if (uVar10 < 2) {
            return AOM_CODEC_CORRUPT_FRAME;
          }
          local_a8.bit_buffer_end = data + data_sz;
          local_a8.bit_offset = 0;
          local_a8.error_handler_data = (void *)0x0;
          local_a8.error_handler = (aom_rb_error_handler)0x0;
          local_a8.bit_buffer = puVar11;
          local_60 = puVar11;
          av1_read_profile(&local_a8);
          iVar2 = aom_rb_read_bit(&local_a8);
          local_c0 = aom_rb_read_bit(&local_a8);
          if ((char)iVar2 == '\0' && (char)local_c0 != '\0') {
            return AOM_CODEC_UNSUP_BITSTREAM;
          }
          if ((char)local_c0 == '\0') {
            iVar2 = aom_rb_read_bit(&local_a8);
            bVar12 = true;
            local_bc = 1;
            if ((char)iVar2 != '\0') {
              uVar4 = aom_rb_read_unsigned_literal(&local_a8,0x20);
              uVar5 = aom_rb_read_unsigned_literal(&local_a8,0x20);
              if (uVar4 == 0) {
                return AOM_CODEC_UNSUP_BITSTREAM;
              }
              if (uVar5 == 0) {
                return AOM_CODEC_UNSUP_BITSTREAM;
              }
              iVar2 = aom_rb_read_bit(&local_a8);
              if (((char)iVar2 != '\0') &&
                 (uVar4 = aom_rb_read_uvlc(&local_a8), uVar4 == 0xffffffff)) {
                return AOM_CODEC_UNSUP_BITSTREAM;
              }
              iVar2 = aom_rb_read_bit(&local_a8);
              if ((char)iVar2 != '\0') {
                iVar2 = aom_rb_read_literal(&local_a8,5);
                aom_rb_read_unsigned_literal(&local_a8,0x20);
                aom_rb_read_literal(&local_a8,5);
                aom_rb_read_literal(&local_a8,5);
                local_bc = iVar2 + 1;
                bVar12 = false;
              }
            }
            local_ac = aom_rb_read_bit(&local_a8);
            uVar6 = aom_rb_read_literal(&local_a8,5);
            iVar9 = 0;
            iVar2 = 0;
            do {
              iVar7 = aom_rb_read_literal(&local_a8,0xc);
              if (iVar2 != 0) {
                iVar7 = iVar9;
              }
              iVar9 = iVar7;
              iVar7 = aom_rb_read_literal(&local_a8,5);
              if (7 < iVar7) {
                aom_rb_read_bit(&local_a8);
              }
              if ((!bVar12) &&
                 (iVar8 = aom_rb_read_bit(&local_a8), iVar7 = local_bc, (char)iVar8 != '\0')) {
                aom_rb_read_unsigned_literal(&local_a8,local_bc);
                aom_rb_read_unsigned_literal(&local_a8,iVar7);
                aom_rb_read_bit(&local_a8);
              }
              if (((char)local_ac != '\0') &&
                 (iVar7 = aom_rb_read_bit(&local_a8), (char)iVar7 != '\0')) {
                aom_rb_read_literal(&local_a8,4);
              }
              iVar2 = iVar2 + 1;
            } while ((uVar6 & 0xff) + 1 != iVar2);
          }
          else {
            aom_rb_read_literal(&local_a8,5);
            iVar9 = 0;
          }
          aVar1 = aom_get_num_layers_from_operating_point_idc(iVar9,local_68,local_70);
          if (aVar1 != AOM_CODEC_OK) {
            return AOM_CODEC_ERROR;
          }
          iVar2 = aom_rb_read_literal(&local_a8,4);
          iVar9 = aom_rb_read_literal(&local_a8,4);
          iVar2 = aom_rb_read_literal(&local_a8,iVar2 + 1);
          iVar9 = aom_rb_read_literal(&local_a8,iVar9 + 1);
          local_78->w = iVar2 + 1;
          local_78->h = iVar9 + 1;
          bVar12 = true;
          puVar11 = local_60;
          si = local_78;
        }
        local_cc = iVar3;
        data_sz = uVar10 - local_c8;
        if (data_sz == 0) {
LAB_0016d9b0:
          if (local_80 == (int *)0x0) {
            return AOM_CODEC_OK;
          }
          *local_80 = local_cc;
          return AOM_CODEC_OK;
        }
        data = puVar11 + local_c8;
        aVar1 = aom_read_obu_header_and_size
                          (data,data_sz,si->is_annexb,&local_58,&local_c8,&local_b8);
        if (aVar1 != AOM_CODEC_OK) {
          return aVar1;
        }
      }
    }
  }
  return aVar1;
}

Assistant:

static aom_codec_err_t decoder_peek_si_internal(const uint8_t *data,
                                                size_t data_sz,
                                                aom_codec_stream_info_t *si,
                                                int *is_intra_only) {
  int intra_only_flag = 0;
  int got_sequence_header = 0;
  int found_keyframe = 0;

  if (data + data_sz <= data || data_sz < 1) return AOM_CODEC_INVALID_PARAM;

  si->w = 0;
  si->h = 0;
  si->is_kf = 0;  // is_kf indicates whether the current packet contains a RAP

  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));
  size_t payload_size = 0;
  size_t bytes_read = 0;
  uint8_t reduced_still_picture_hdr = 0;
  aom_codec_err_t status = aom_read_obu_header_and_size(
      data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
  if (status != AOM_CODEC_OK) return status;

  // If the first OBU is a temporal delimiter, skip over it and look at the next
  // OBU in the bitstream
  if (obu_header.type == OBU_TEMPORAL_DELIMITER) {
    // Skip any associated payload (there shouldn't be one, but just in case)
    if (data_sz < bytes_read + payload_size) return AOM_CODEC_CORRUPT_FRAME;
    data += bytes_read + payload_size;
    data_sz -= bytes_read + payload_size;

    status = aom_read_obu_header_and_size(
        data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
    if (status != AOM_CODEC_OK) return status;
  }
  while (1) {
    data += bytes_read;
    data_sz -= bytes_read;
    if (data_sz < payload_size) return AOM_CODEC_CORRUPT_FRAME;
    // Check that the selected OBU is a sequence header
    if (obu_header.type == OBU_SEQUENCE_HEADER) {
      // Sanity check on sequence header size
      if (data_sz < 2) return AOM_CODEC_CORRUPT_FRAME;
      // Read a few values from the sequence header payload
      struct aom_read_bit_buffer rb = { data, data + data_sz, 0, NULL, NULL };

      av1_read_profile(&rb);  // profile
      const uint8_t still_picture = aom_rb_read_bit(&rb);
      reduced_still_picture_hdr = aom_rb_read_bit(&rb);

      if (!still_picture && reduced_still_picture_hdr) {
        return AOM_CODEC_UNSUP_BITSTREAM;
      }

      status = parse_operating_points(&rb, reduced_still_picture_hdr, si);
      if (status != AOM_CODEC_OK) return status;

      int num_bits_width = aom_rb_read_literal(&rb, 4) + 1;
      int num_bits_height = aom_rb_read_literal(&rb, 4) + 1;
      int max_frame_width = aom_rb_read_literal(&rb, num_bits_width) + 1;
      int max_frame_height = aom_rb_read_literal(&rb, num_bits_height) + 1;
      si->w = max_frame_width;
      si->h = max_frame_height;
      got_sequence_header = 1;
    } else if (obu_header.type == OBU_FRAME_HEADER ||
               obu_header.type == OBU_FRAME) {
      if (got_sequence_header && reduced_still_picture_hdr) {
        found_keyframe = 1;
        break;
      } else {
        // make sure we have enough bits to get the frame type out
        if (data_sz < 1) return AOM_CODEC_CORRUPT_FRAME;
        struct aom_read_bit_buffer rb = { data, data + data_sz, 0, NULL, NULL };
        const int show_existing_frame = aom_rb_read_bit(&rb);
        if (!show_existing_frame) {
          const FRAME_TYPE frame_type = (FRAME_TYPE)aom_rb_read_literal(&rb, 2);
          if (frame_type == KEY_FRAME) {
            found_keyframe = 1;
            break;  // Stop here as no further OBUs will change the outcome.
          } else if (frame_type == INTRA_ONLY_FRAME) {
            intra_only_flag = 1;
          }
        }
      }
    }
    // skip past any unread OBU header data
    data += payload_size;
    data_sz -= payload_size;
    if (data_sz == 0) break;  // exit if we're out of OBUs
    status = aom_read_obu_header_and_size(
        data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
    if (status != AOM_CODEC_OK) return status;
  }
  if (got_sequence_header && found_keyframe) si->is_kf = 1;
  if (is_intra_only != NULL) *is_intra_only = intra_only_flag;
  return AOM_CODEC_OK;
}